

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_type_info.hpp
# Opt level: O2

string * __thiscall
duckdb::LogicalTypeModifier::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogicalTypeModifier *this)

{
  if ((this->label)._M_string_length == 0) {
    Value::ToString_abi_cxx11_(__return_storage_ptr__,&this->value);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->label);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {
		return label.empty() ? value.ToString() : label;
	}